

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 9_count_char_in_string.cpp
# Opt level: O0

int count_char(char *str,char ch)

{
  ostream *poVar1;
  int local_18;
  int count;
  char ch_local;
  char *str_local;
  
  local_18 = 0;
  for (_count = str; *_count != '\0'; _count = _count + 1) {
    poVar1 = std::operator<<((ostream *)&std::cout,"===>");
    poVar1 = std::operator<<(poVar1,*_count);
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    if (*_count == ch) {
      local_18 = local_18 + 1;
    }
  }
  return local_18;
}

Assistant:

int count_char(const char * str, char ch)
{
    int count = 0;
    //  *str 是地址处的字符
    while(*str) {
        std::cout << "===>" << *str << std::endl;
        if (*str == ch) {
            count++;
        }
        //  地址+1，指向下一个字符
        str++;
    }
    return count;
}